

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgensubstruct.cpp
# Opt level: O3

void InitializeMatrices(TPZSubCompMesh *submesh,TPZAutoPointer<TPZDohrSubstruct<double>_> *substruct
                       ,TPZDohrAssembly<double> *dohrassembly)

{
  TPZDohrSubstruct<double> *pTVar1;
  long lVar2;
  int64_t maxeq;
  pointer_____offset_0x68___ *vtt;
  undefined8 uVar3;
  int iVar4;
  TPZGuiInterface *this;
  TPZBaseMatrix *pTVar5;
  _func_int *p_Var6;
  undefined4 extraout_var;
  TPZAutoPointer<TPZGuiInterface> toto;
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_> skylstr;
  TPZFMatrix<double> rhs;
  TPZManVector<long,_10> invpermute;
  TPZAutoPointer<TPZGuiInterface> local_278;
  TPZAutoPointer<TPZBaseMatrix> local_270;
  TPZAutoPointer<TPZBaseMatrix> local_268;
  TPZAutoPointer<TPZGuiInterface> local_260;
  TPZAutoPointer<TPZGuiInterface> local_258;
  pointer_____offset_0x68___ *local_250;
  undefined1 local_248 [32];
  undefined1 local_228 [168];
  undefined **local_180;
  void *local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined **local_160;
  void *local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined4 local_138;
  undefined1 local_134;
  TPZFMatrix<double> local_130;
  TPZManVector<long,_10> local_a0;
  
  local_140 = 0x1924960;
  local_228._0_8_ = 0x1924a28;
  local_138 = 0;
  local_134 = 1;
  TPZStructMatrix::TPZStructMatrix
            ((TPZStructMatrix *)local_228,&PTR_construction_vtable_104__01924280,
             &submesh->super_TPZCompMesh);
  local_140 = 0x1924438;
  local_228._0_8_ = 0x1924358;
  TPZStructMatrixOR<double>::TPZStructMatrixOR
            ((TPZStructMatrixOR<double> *)(local_228 + 0xa0),&PTR_construction_vtable_104__019242a8)
  ;
  local_248._8_8_ = 0x1924200;
  local_140 = 0x1924200;
  local_248._0_8_ = 0x1924038;
  local_228._0_8_ = 0x1924038;
  local_228._160_8_ = 0x1924100;
  local_180 = &PTR__TPZVec_01813f30;
  local_178 = (void *)0x0;
  uStack_170 = 0;
  local_168 = 0;
  local_248._16_8_ = &PTR__TPZVec_01813f30;
  local_160 = &PTR__TPZVec_01813f30;
  local_158 = (void *)0x0;
  uStack_150 = 0;
  local_148 = 0;
  this = (TPZGuiInterface *)operator_new(0x40);
  TPZGuiInterface::TPZGuiInterface(this);
  local_278.fRef = (TPZReference *)operator_new(0x10);
  local_250 = &PTR_construction_vtable_104__01924280;
  ((local_278.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_278.fRef)->fPointer = this;
  LOCK();
  ((local_278.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  local_228[0x58] = false;
  local_248._24_8_ = submesh;
  TPZVec<long>::Resize((TPZVec<long> *)(local_228 + 0x60),0);
  TPZVec<long>::Resize((TPZVec<long> *)(local_228 + 0x80),0);
  pTVar1 = substruct->fRef->fPointer;
  lVar2 = *(long *)(local_228._0_8_ + -0x60);
  local_258.fRef = local_278.fRef;
  LOCK();
  ((local_278.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_278.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pTVar5 = TPZStrMatParInterface::CreateAssemble
                     ((TPZStrMatParInterface *)(&((TPZStructMatrix *)local_228)->field_0x0 + lVar2),
                      (TPZBaseMatrix *)&pTVar1->fLocalLoad,&local_258);
  if (pTVar5 == (TPZBaseMatrix *)0x0) {
    p_Var6 = (_func_int *)0x0;
  }
  else {
    p_Var6 = (_func_int *)
             __dynamic_cast(pTVar5,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  }
  local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)operator_new(0x10);
  *(undefined4 *)
   (local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable + 1) = 0
  ;
  *local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = p_Var6;
  LOCK();
  *(undefined4 *)
   (local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable + 1) = 1
  ;
  UNLOCK();
  TPZAutoPointer<TPZMatrix<double>_>::operator=
            (&substruct->fRef->fPointer->fStiffness,(TPZAutoPointer<TPZMatrix<double>_> *)&local_130
            );
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)&local_130);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_258);
  pTVar1 = substruct->fRef->fPointer;
  iVar4 = (*(((pTVar1->fStiffness).fRef)->fPointer->super_TPZBaseMatrix).super_TPZSavable.
            _vptr_TPZSavable[0x1e])();
  local_268.fRef = (TPZReference *)0x0;
  local_268.fRef = (TPZReference *)operator_new(0x10);
  ((local_268.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_268.fRef)->fPointer = (TPZBaseMatrix *)CONCAT44(extraout_var,iVar4);
  LOCK();
  ((local_268.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  TPZMatrixSolver<double>::SetMatrix
            (&(pTVar1->fInvertedStiffness).super_TPZMatrixSolver<double>,&local_268);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(&local_268);
  TPZStepSolver<double>::SetDirect(&substruct->fRef->fPointer->fInvertedStiffness,ECholesky);
  TPZManVector<long,_10>::TPZManVector(&local_a0,0);
  uVar3 = local_248._24_8_;
  TPZGenSubStruct::ReorderInternalNodes2
            ((TPZSubCompMesh *)local_248._24_8_,&substruct->fRef->fPointer->fInternalEqs,
             &local_a0.super_TPZVec<long>);
  maxeq = (substruct->fRef->fPointer->fInternalEqs).fNElements;
  local_228[0x58] = false;
  TPZVec<long>::Resize((TPZVec<long> *)(local_228 + 0x60),0);
  TPZVec<long>::Resize((TPZVec<long> *)(local_228 + 0x80),0);
  TPZEquationFilter::SetMinMaxEq((TPZEquationFilter *)(local_228 + 0x48),0,maxeq);
  local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_130.fElem = (double *)0x0;
  local_130.fGiven = (double *)0x0;
  local_130.fSize = 0;
  TPZVec<int>::TPZVec(&local_130.fPivot.super_TPZVec<int>,0);
  local_130.fPivot.super_TPZVec<int>.fStore = local_130.fPivot.fExtAlloc;
  local_130.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_130.fPivot.super_TPZVec<int>.fNElements = 0;
  local_130.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_130.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_130.fWork.fStore = (double *)0x0;
  local_130.fWork.fNElements = 0;
  local_130.fWork.fNAlloc = 0;
  pTVar1 = substruct->fRef->fPointer;
  lVar2 = *(long *)(local_228._0_8_ + -0x60);
  local_260.fRef = local_278.fRef;
  LOCK();
  ((local_278.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_278.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pTVar5 = TPZStrMatParInterface::CreateAssemble
                     ((TPZStrMatParInterface *)(&((TPZStructMatrix *)local_228)->field_0x0 + lVar2),
                      (TPZBaseMatrix *)&local_130,&local_260);
  if (pTVar5 == (TPZBaseMatrix *)0x0) {
    pTVar5 = (TPZBaseMatrix *)0x0;
  }
  else {
    pTVar5 = (TPZBaseMatrix *)
             __dynamic_cast(pTVar5,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  }
  local_270.fRef = (TPZReference *)0x0;
  local_270.fRef = (TPZReference *)operator_new(0x10);
  ((local_270.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_270.fRef)->fPointer = pTVar5;
  LOCK();
  ((local_270.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  TPZMatrixSolver<double>::SetMatrix
            (&(pTVar1->fInvertedInternalStiffness).super_TPZMatrixSolver<double>,&local_270);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(&local_270);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_260);
  TPZStepSolver<double>::SetDirect(&substruct->fRef->fPointer->fInvertedInternalStiffness,ECholesky)
  ;
  vtt = local_250;
  TPZCompMesh::Permute((TPZCompMesh *)uVar3,&local_a0.super_TPZVec<long>);
  TPZFMatrix<double>::~TPZFMatrix(&local_130);
  TPZManVector<long,_10>::~TPZManVector(&local_a0);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_278);
  uVar3 = local_248._16_8_;
  local_140 = local_248._8_8_;
  local_228._0_8_ = local_248._0_8_;
  local_228._160_8_ = 0x1924100;
  local_160 = (undefined **)local_248._16_8_;
  if (local_158 != (void *)0x0) {
    operator_delete__(local_158);
  }
  local_180 = (undefined **)uVar3;
  if (local_178 != (void *)0x0) {
    operator_delete__(local_178);
  }
  TPZStructMatrix::~TPZStructMatrix((TPZStructMatrix *)local_228,vtt);
  return;
}

Assistant:

void InitializeMatrices(TPZSubCompMesh *submesh, TPZAutoPointer<TPZDohrSubstruct<STATE> > substruct, TPZDohrAssembly<STATE> &dohrassembly)
{
	// this should happen in the remote processor
    TPZSkylineStructMatrix<STATE> skylstr(submesh);
	TPZAutoPointer<TPZGuiInterface> toto = new TPZGuiInterface;

	skylstr.EquationFilter().Reset();
    substruct->fStiffness = TPZAutoPointer<TPZMatrix<STATE> > (
		dynamic_cast<TPZMatrix<STATE>*>(skylstr.CreateAssemble(substruct->fLocalLoad,toto)));
	
	// This should happen in the remote processor
    substruct->fInvertedStiffness.SetMatrix(substruct->fStiffness->Clone());
    substruct->fInvertedStiffness.SetDirect(ECholesky);
	
	TPZManVector<int64_t> invpermute;
	TPZGenSubStruct::ReorderInternalNodes2(submesh,substruct->fInternalEqs,invpermute);
	// compute the stiffness matrix associated with the internal nodes
	// fInternalEqs indicates the permutation of the global equations to the numbering of the internal equations
	// this is meaningless if the internal nodes are invisible to the global structure
    int64_t ninternal = substruct->fInternalEqs.NElements();
	// THIS SHOULD HAPPEN IN THE REMOTE PROCESSOR
    skylstr.SetEquationRange(0,ninternal);
    TPZFMatrix<STATE> rhs;
    substruct->fInvertedInternalStiffness.SetMatrix(
		dynamic_cast<TPZMatrix<STATE>*>(skylstr.CreateAssemble(rhs,toto)));
    substruct->fInvertedInternalStiffness.SetDirect(ECholesky);
	
    // put back the original sequence numbers of the connects (otherwise we can't apply a load solution
    
	submesh->Permute(invpermute);
	
}